

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory>::operator=
          (RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory> *this,
          RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory> *AutoPtr)

{
  IShaderSourceInputStreamFactory *pIVar1;
  IShaderSourceInputStreamFactory *pObj;
  
  pIVar1 = AutoPtr->m_pObject;
  if (this->m_pObject != pIVar1) {
    AutoPtr->m_pObject = (IShaderSourceInputStreamFactory *)0x0;
    Release(this);
    this->m_pObject = pIVar1;
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }